

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O1

RealType __thiscall OpenMD::ForceField::getRcutFromAtomType(ForceField *this,AtomType *at)

{
  bool bVar1;
  EAMType EVar2;
  double dVar3;
  RealType RVar4;
  RealType RVar5;
  EAMAdapter ea;
  StickyAdapter sa;
  GayBerneAdapter gba;
  SuttonChenAdapter sca;
  LennardJonesAdapter lja;
  double local_48;
  EAMAdapter local_38;
  StickyAdapter local_30;
  GayBerneAdapter local_28;
  SuttonChenAdapter local_20;
  LennardJonesAdapter local_18;
  
  local_18.at_ = at;
  bVar1 = LennardJonesAdapter::isLennardJones(&local_18);
  dVar3 = 0.0;
  if (bVar1) {
    RVar4 = LennardJonesAdapter::getSigma(&local_18);
    dVar3 = RVar4 * 2.5;
  }
  local_38.at_ = at;
  bVar1 = EAMAdapter::isEAM(&local_38);
  local_48 = dVar3;
  if (bVar1) {
    EVar2 = EAMAdapter::getEAMType(&local_38);
    if (EVar2 - eamZhou2001 < 2) {
      RVar4 = EAMAdapter::getLatticeConstant(&local_38);
      local_48 = RVar4 * 3.1622776601683795 * 0.5;
    }
    else {
      if (EVar2 != eamFuncfl) goto LAB_00185b07;
      local_48 = EAMAdapter::getRcut(&local_38);
    }
    if (local_48 <= dVar3) {
      local_48 = dVar3;
    }
  }
LAB_00185b07:
  local_20.at_ = at;
  bVar1 = SuttonChenAdapter::isSuttonChen(&local_20);
  dVar3 = local_48;
  if (bVar1) {
    RVar4 = SuttonChenAdapter::getAlpha(&local_20);
    dVar3 = RVar4 + RVar4;
    if (RVar4 + RVar4 <= local_48) {
      dVar3 = local_48;
    }
  }
  local_48 = dVar3;
  local_28.at_ = at;
  bVar1 = GayBerneAdapter::isGayBerne(&local_28);
  dVar3 = local_48;
  if (bVar1) {
    RVar5 = GayBerneAdapter::getD(&local_28);
    RVar4 = GayBerneAdapter::getL(&local_28);
    if (RVar4 <= RVar5) {
      RVar4 = RVar5;
    }
    dVar3 = RVar4 * 3.5355339059327378;
    if (RVar4 * 3.5355339059327378 <= local_48) {
      dVar3 = local_48;
    }
  }
  local_48 = dVar3;
  local_30.at_ = at;
  bVar1 = StickyAdapter::isSticky(&local_30);
  dVar3 = local_48;
  if (bVar1) {
    RVar4 = StickyAdapter::getRu(&local_30);
    dVar3 = StickyAdapter::getRup(&local_30);
    if (dVar3 <= RVar4) {
      dVar3 = RVar4;
    }
    if (dVar3 <= local_48) {
      dVar3 = local_48;
    }
  }
  return dVar3;
}

Assistant:

RealType ForceField::getRcutFromAtomType(AtomType* at) {
    RealType rcut(0.0);

    LennardJonesAdapter lja = LennardJonesAdapter(at);
    if (lja.isLennardJones()) { rcut = 2.5 * lja.getSigma(); }
    EAMAdapter ea = EAMAdapter(at);
    if (ea.isEAM()) {
      switch (ea.getEAMType()) {
      case eamFuncfl:
        rcut = max(rcut, ea.getRcut());
        break;
      case eamZhou2001:
      case eamZhou2004:
        rcut = max(rcut, ea.getLatticeConstant() * sqrt(10.0) / 2.0);
        break;
      default:
        break;
      }
    }
    SuttonChenAdapter sca = SuttonChenAdapter(at);
    if (sca.isSuttonChen()) { rcut = max(rcut, 2.0 * sca.getAlpha()); }
    GayBerneAdapter gba = GayBerneAdapter(at);
    if (gba.isGayBerne()) {
      rcut = max(rcut, 2.5 * sqrt(2.0) * max(gba.getD(), gba.getL()));
    }
    StickyAdapter sa = StickyAdapter(at);
    if (sa.isSticky()) { rcut = max(rcut, max(sa.getRu(), sa.getRup())); }

    return rcut;
  }